

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O1

Map_Cut_t * Map_CutSortCuts(Map_Man_t *pMan,Map_CutTable_t *p,Map_Cut_t *pList)

{
  Map_Cut_t **ppMVar1;
  Map_Cut_t *pMVar2;
  Map_Cut_t *pMVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Map_Cut_t *pListNew;
  Map_Cut_t *local_28;
  
  pMVar2 = (Map_Cut_t *)&stack0xffffffffffffffd8;
  if (pList == (Map_Cut_t *)0x0) {
    uVar6 = 0;
  }
  else {
    ppMVar1 = p->pCuts1;
    uVar6 = 0;
    do {
      ppMVar1[uVar6] = pList;
      pList = pList->pNext;
      uVar6 = uVar6 + 1;
    } while (pList != (Map_Cut_t *)0x0);
  }
  uVar5 = (uint)uVar6;
  if (1000 < (int)uVar5) {
    __assert_fail("nCuts <= MAP_CUTS_MAX_COMPUTE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                  ,0x3ef,"Map_Cut_t *Map_CutSortCuts(Map_Man_t *, Map_CutTable_t *, Map_Cut_t *)");
  }
  qsort(p->pCuts1,(long)(int)uVar5,8,Map_CutSortCutsCompare);
  if (0xf9 < (int)uVar5) {
    uVar4 = 0xf9;
    do {
      Extra_MmFixedEntryRecycle(pMan->mmCuts,(char *)p->pCuts1[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uVar6 & 0xffffffff) != uVar4);
    uVar5 = 0xf9;
  }
  ppMVar1 = p->pCuts1;
  local_28 = (Map_Cut_t *)0x0;
  pMVar3 = (Map_Cut_t *)&stack0xffffffffffffffd8;
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      pMVar2->pNext = ppMVar1[uVar6];
      pMVar2 = ppMVar1[uVar6];
      uVar6 = uVar6 + 1;
      pMVar3 = pMVar2;
    } while (uVar5 != uVar6);
  }
  pMVar3->pNext = (Map_Cut_t *)0x0;
  return local_28;
}

Assistant:

Map_Cut_t * Map_CutSortCuts( Map_Man_t * pMan, Map_CutTable_t * p, Map_Cut_t * pList )
{
    Map_Cut_t * pListNew;
    int nCuts, i;
//    abctime clk;
    // move the cuts from the list into the array
    nCuts = Map_CutList2Array( p->pCuts1, pList );
    assert( nCuts <= MAP_CUTS_MAX_COMPUTE );
    // sort the cuts
//clk = Abc_Clock();
    qsort( (void *)p->pCuts1, (size_t)nCuts, sizeof(Map_Cut_t *), 
            (int (*)(const void *, const void *)) Map_CutSortCutsCompare );
//pMan->time2 += Abc_Clock() - clk;
    // move them back into the list
    if ( nCuts > MAP_CUTS_MAX_USE - 1 )
    {
        // free the remaining cuts
        for ( i = MAP_CUTS_MAX_USE - 1; i < nCuts; i++ )
            Extra_MmFixedEntryRecycle( pMan->mmCuts, (char *)p->pCuts1[i] );
        // update the number of cuts
        nCuts = MAP_CUTS_MAX_USE - 1;
    }
    pListNew = Map_CutArray2List( p->pCuts1, nCuts );
    return pListNew;
}